

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O3

void FT_GlyphLoader_Adjust_Points(FT_GlyphLoader loader)

{
  short sVar1;
  FT_Vector *pFVar2;
  char *pcVar3;
  short *psVar4;
  
  pFVar2 = (loader->base).outline.points;
  if (pFVar2 == (FT_Vector *)0x0) {
    pFVar2 = (FT_Vector *)0x0;
  }
  else {
    pFVar2 = pFVar2 + (loader->base).outline.n_points;
  }
  (loader->current).outline.points = pFVar2;
  pcVar3 = (loader->base).outline.tags;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = pcVar3 + (loader->base).outline.n_points;
  }
  (loader->current).outline.tags = pcVar3;
  psVar4 = (loader->base).outline.contours;
  if (psVar4 == (short *)0x0) {
    psVar4 = (short *)0x0;
  }
  else {
    psVar4 = psVar4 + (loader->base).outline.n_contours;
  }
  (loader->current).outline.contours = psVar4;
  if (loader->use_extra != '\0') {
    sVar1 = (loader->base).outline.n_points;
    (loader->current).extra_points = (loader->base).extra_points + sVar1;
    (loader->current).extra_points2 = (loader->base).extra_points2 + sVar1;
  }
  return;
}

Assistant:

static void
  FT_GlyphLoader_Adjust_Points( FT_GlyphLoader  loader )
  {
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;


    current->points   = FT_OFFSET( base->points,   base->n_points );
    current->tags     = FT_OFFSET( base->tags,     base->n_points );
    current->contours = FT_OFFSET( base->contours, base->n_contours );

    /* handle extra points table - if any */
    if ( loader->use_extra )
    {
      loader->current.extra_points  = loader->base.extra_points +
                                      base->n_points;

      loader->current.extra_points2 = loader->base.extra_points2 +
                                      base->n_points;
    }
  }